

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isorr_rr_moved.c
# Opt level: O1

void test_read_format_isorr_rr_moved(void)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  mode_t mVar4;
  archive_conflict *a;
  char *pcVar5;
  long v2;
  la_int64_t lVar6;
  time_t tVar7;
  stat *psVar8;
  longlong lVar9;
  archive_entry *ae;
  int64_t offset;
  void *p;
  size_t size;
  archive_entry *local_50;
  longlong local_48;
  void *local_40;
  int local_38 [2];
  
  extract_reference_file("test_read_format_iso_rockridge_rr_moved.iso.Z");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                   ,L'G',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'H',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'I',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  wVar2 = archive_read_open_filename(a,"test_read_format_iso_rockridge_rr_moved.iso.Z",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'K',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  iVar1 = 0xd;
  do {
    iVar3 = archive_read_next_header((archive *)a,&local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                        ,L'P',0,"0",(long)iVar3,"archive_read_next_header(a, &ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                        ,L'R',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar3 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                        ,L'S',(long)iVar3,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
    pcVar5 = archive_entry_pathname(local_50);
    iVar3 = strcmp(".",pcVar5);
    if (iVar3 == 0) {
      mVar4 = archive_entry_filetype(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'W',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                          (void *)0x0);
      lVar6 = archive_entry_size(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'X',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
      tVar7 = archive_entry_mtime(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'Z',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
      v2 = archive_entry_mtime_nsec(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'[',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
      psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L']',3,"3",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                          (void *)0x0);
      lVar6 = archive_entry_uid(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'^',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
      iVar3 = archive_read_data_block((archive *)a,&local_40,(size_t *)local_38,&local_48);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'`',1,"ARCHIVE_EOF",(long)iVar3,
                          "archive_read_data_block(a, &p, &size, &offset)",a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'a',(long)local_38[0],"(int)size",0,"0",(void *)0x0);
    }
    else {
      pcVar5 = archive_entry_pathname(local_50);
      iVar3 = strcmp("dir1",pcVar5);
      pcVar5 = archive_entry_pathname(local_50);
      if (iVar3 == 0) {
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                   ,L'd',"dir1","\"dir1\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        mVar4 = archive_entry_filetype(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'e',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                            (void *)0x0);
        lVar6 = archive_entry_size(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'f',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
        tVar7 = archive_entry_mtime(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'g',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
        tVar7 = archive_entry_atime(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'h',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
        psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'i',3,"3",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                            (void *)0x0);
        lVar6 = archive_entry_uid(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'j',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
        lVar6 = archive_entry_gid(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'k',2,"2",lVar6,"archive_entry_gid(ae)",(void *)0x0);
      }
      else {
        iVar3 = strcmp("dir1/dir2",pcVar5);
        pcVar5 = archive_entry_pathname(local_50);
        if (iVar3 == 0) {
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                     ,L'p',"dir1/dir2","\"dir1/dir2\"",pcVar5,"archive_entry_pathname(ae)",
                     (void *)0x0,L'\0');
          mVar4 = archive_entry_filetype(local_50);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L'q',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                              (void *)0x0);
          lVar6 = archive_entry_size(local_50);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L'r',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
          tVar7 = archive_entry_mtime(local_50);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L's',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
          tVar7 = archive_entry_atime(local_50);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L't',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
          psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L'u',3,"3",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                              (void *)0x0);
          lVar6 = archive_entry_uid(local_50);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L'v',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
          lVar9 = archive_entry_gid(local_50);
          wVar2 = L'w';
        }
        else {
          iVar3 = strcmp("dir1/dir2/dir3",pcVar5);
          pcVar5 = archive_entry_pathname(local_50);
          if (iVar3 == 0) {
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                       ,L'|',"dir1/dir2/dir3","\"dir1/dir2/dir3\"",pcVar5,
                       "archive_entry_pathname(ae)",(void *)0x0,L'\0');
            mVar4 = archive_entry_filetype(local_50);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'}',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                                (void *)0x0);
            lVar6 = archive_entry_size(local_50);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'~',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
            tVar7 = archive_entry_mtime(local_50);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'\x7f',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0
                               );
            tVar7 = archive_entry_atime(local_50);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'\x80',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0
                               );
            psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'\x81',3,"3",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                                (void *)0x0);
            lVar6 = archive_entry_uid(local_50);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'\x82',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
            lVar9 = archive_entry_gid(local_50);
            wVar2 = L'\x83';
          }
          else {
            iVar3 = strcmp("dir1/dir2/dir3/dir4",pcVar5);
            pcVar5 = archive_entry_pathname(local_50);
            if (iVar3 == 0) {
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                         ,L'\x88',"dir1/dir2/dir3/dir4","\"dir1/dir2/dir3/dir4\"",pcVar5,
                         "archive_entry_pathname(ae)",(void *)0x0,L'\0');
              mVar4 = archive_entry_filetype(local_50);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x89',0x4000,"AE_IFDIR",(ulong)mVar4,
                                  "archive_entry_filetype(ae)",(void *)0x0);
              lVar6 = archive_entry_size(local_50);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8a',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
              tVar7 = archive_entry_mtime(local_50);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8b',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                  (void *)0x0);
              tVar7 = archive_entry_atime(local_50);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8c',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                  (void *)0x0);
              psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8d',3,"3",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink"
                                  ,(void *)0x0);
              lVar6 = archive_entry_uid(local_50);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8e',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
              lVar9 = archive_entry_gid(local_50);
              wVar2 = L'\x8f';
            }
            else {
              iVar3 = strcmp("dir1/dir2/dir3/dir4/dir5",pcVar5);
              pcVar5 = archive_entry_pathname(local_50);
              if (iVar3 == 0) {
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                           ,L'\x94',"dir1/dir2/dir3/dir4/dir5","\"dir1/dir2/dir3/dir4/dir5\"",pcVar5
                           ,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
                mVar4 = archive_entry_filetype(local_50);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x95',0x4000,"AE_IFDIR",(ulong)mVar4,
                                    "archive_entry_filetype(ae)",(void *)0x0);
                lVar6 = archive_entry_size(local_50);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x96',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0
                                   );
                tVar7 = archive_entry_mtime(local_50);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x97',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                    (void *)0x0);
                tVar7 = archive_entry_atime(local_50);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x98',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                    (void *)0x0);
                psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x99',3,"3",psVar8->st_nlink,
                                    "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                lVar6 = archive_entry_uid(local_50);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x9a',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
                lVar9 = archive_entry_gid(local_50);
                wVar2 = L'\x9b';
              }
              else {
                iVar3 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6",pcVar5);
                pcVar5 = archive_entry_pathname(local_50);
                if (iVar3 == 0) {
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                             ,L'\xa0',"dir1/dir2/dir3/dir4/dir5/dir6",
                             "\"dir1/dir2/dir3/dir4/dir5/dir6\"",pcVar5,"archive_entry_pathname(ae)"
                             ,(void *)0x0,L'\0');
                  mVar4 = archive_entry_filetype(local_50);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'¡',0x4000,"AE_IFDIR",(ulong)mVar4,
                                      "archive_entry_filetype(ae)",(void *)0x0);
                  lVar6 = archive_entry_size(local_50);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'¢',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0
                                     );
                  tVar7 = archive_entry_mtime(local_50);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'£',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                      (void *)0x0);
                  tVar7 = archive_entry_atime(local_50);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'¤',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                      (void *)0x0);
                  psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'¥',3,"3",psVar8->st_nlink,
                                      "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                  lVar6 = archive_entry_uid(local_50);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'¦',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
                  lVar9 = archive_entry_gid(local_50);
                  wVar2 = L'§';
                }
                else {
                  iVar3 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7",pcVar5);
                  pcVar5 = archive_entry_pathname(local_50);
                  if (iVar3 == 0) {
                    assertion_equal_string
                              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                               ,L'¬',"dir1/dir2/dir3/dir4/dir5/dir6/dir7",
                               "\"dir1/dir2/dir3/dir4/dir5/dir6/dir7\"",pcVar5,
                               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
                    mVar4 = archive_entry_filetype(local_50);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'­',0x4000,"AE_IFDIR",(ulong)mVar4,
                                        "archive_entry_filetype(ae)",(void *)0x0);
                    lVar6 = archive_entry_size(local_50);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'®',0x800,"2048",lVar6,"archive_entry_size(ae)",
                                        (void *)0x0);
                    tVar7 = archive_entry_mtime(local_50);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'¯',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                        (void *)0x0);
                    tVar7 = archive_entry_atime(local_50);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'°',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                        (void *)0x0);
                    psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'±',3,"3",psVar8->st_nlink,
                                        "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                    lVar6 = archive_entry_uid(local_50);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'²',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
                    lVar9 = archive_entry_gid(local_50);
                    wVar2 = L'³';
                  }
                  else {
                    iVar3 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8",pcVar5);
                    pcVar5 = archive_entry_pathname(local_50);
                    if (iVar3 == 0) {
                      assertion_equal_string
                                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                 ,L'º',"dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8",
                                 "\"dir1/dir2/dir3/dir4/dir5/dir6/dir7\" \"/dir8\"",pcVar5,
                                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
                      mVar4 = archive_entry_filetype(local_50);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'»',0x4000,"AE_IFDIR",(ulong)mVar4,
                                          "archive_entry_filetype(ae)",(void *)0x0);
                      lVar6 = archive_entry_size(local_50);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'¼',0x800,"2048",lVar6,"archive_entry_size(ae)",
                                          (void *)0x0);
                      tVar7 = archive_entry_mtime(local_50);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'½',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                          (void *)0x0);
                      tVar7 = archive_entry_atime(local_50);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'¾',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                          (void *)0x0);
                      psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'¿',3,"3",psVar8->st_nlink,
                                          "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                      lVar6 = archive_entry_uid(local_50);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'À',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
                      lVar9 = archive_entry_gid(local_50);
                      wVar2 = L'Á';
                    }
                    else {
                      iVar3 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9",pcVar5);
                      pcVar5 = archive_entry_pathname(local_50);
                      if (iVar3 == 0) {
                        assertion_equal_string
                                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                   ,L'È',"dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9",
                                   "\"dir1/dir2/dir3/dir4/dir5/dir6/dir7\" \"/dir8/dir9\"",pcVar5,
                                   "archive_entry_pathname(ae)",(void *)0x0,L'\0');
                        mVar4 = archive_entry_filetype(local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'É',0x4000,"AE_IFDIR",(ulong)mVar4,
                                            "archive_entry_filetype(ae)",(void *)0x0);
                        lVar6 = archive_entry_size(local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ê',0x800,"2048",lVar6,"archive_entry_size(ae)",
                                            (void *)0x0);
                        tVar7 = archive_entry_mtime(local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ë',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                            (void *)0x0);
                        tVar7 = archive_entry_atime(local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ì',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                            (void *)0x0);
                        psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Í',3,"3",psVar8->st_nlink,
                                            "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                        lVar6 = archive_entry_uid(local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Î',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
                        lVar9 = archive_entry_gid(local_50);
                        wVar2 = L'Ï';
                      }
                      else {
                        iVar3 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9/dir10",pcVar5);
                        pcVar5 = archive_entry_pathname(local_50);
                        if (iVar3 != 0) {
                          iVar3 = strcmp("file",pcVar5);
                          pcVar5 = archive_entry_pathname(local_50);
                          if (iVar3 == 0) {
                            assertion_equal_string
                                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                       ,L'à',"file","\"file\"",pcVar5,"archive_entry_pathname(ae)",
                                       (void *)0x0,L'\0');
                            mVar4 = archive_entry_filetype(local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'á',0x8000,"AE_IFREG",(ulong)mVar4,
                                                "archive_entry_filetype(ae)",(void *)0x0);
                            lVar6 = archive_entry_size(local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'â',0xbc6154,"12345684",lVar6,
                                                "archive_entry_size(ae)",(void *)0x0);
                            iVar3 = archive_read_data_block
                                              ((archive *)a,&local_40,(size_t *)local_38,&local_48);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ä',0,"0",(long)iVar3,
                                                "archive_read_data_block(a, &p, &size, &offset)",
                                                (void *)0x0);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'å',0,"0",local_48,"offset",(void *)0x0);
                            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'æ',local_40,"p","hello\n","\"hello\\n\"",6,"6",
                                                (void *)0x0);
                            tVar7 = archive_entry_mtime(local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ç',0x15181,"86401",tVar7,
                                                "archive_entry_mtime(ae)",(void *)0x0);
                            tVar7 = archive_entry_atime(local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'è',0x15181,"86401",tVar7,
                                                "archive_entry_atime(ae)",(void *)0x0);
                            psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'é',1,"1",psVar8->st_nlink,
                                                "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                            lVar6 = archive_entry_uid(local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ê',1,"1",lVar6,"archive_entry_uid(ae)",
                                                (void *)0x0);
                            lVar9 = archive_entry_gid(local_50);
                            wVar2 = L'ë';
                          }
                          else {
                            iVar3 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9/dir10/deep"
                                           ,pcVar5);
                            if (iVar3 != 0) {
                              failure("Saw a file that shouldn\'t have been there");
                              pcVar5 = archive_entry_pathname(local_50);
                              assertion_equal_string
                                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                         ,L'Ā',pcVar5,"archive_entry_pathname(ae)","","\"\"",
                                         (void *)0x0,L'\0');
                              goto LAB_001779e7;
                            }
                            pcVar5 = archive_entry_pathname(local_50);
                            assertion_equal_string
                                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                       ,L'ò',
                                       "dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9/dir10/deep",
                                       "\"dir1/dir2/dir3/dir4/dir5/dir6/dir7\" \"/dir8/dir9/dir10/deep\""
                                       ,pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
                            mVar4 = archive_entry_filetype(local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ó',0x8000,"AE_IFREG",(ulong)mVar4,
                                                "archive_entry_filetype(ae)",(void *)0x0);
                            lVar6 = archive_entry_size(local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ô',0xbc6154,"12345684",lVar6,
                                                "archive_entry_size(ae)",(void *)0x0);
                            iVar3 = archive_read_data_block
                                              ((archive *)a,&local_40,(size_t *)local_38,&local_48);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ö',0,"0",(long)iVar3,
                                                "archive_read_data_block(a, &p, &size, &offset)",
                                                (void *)0x0);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'÷',0,"0",local_48,"offset",(void *)0x0);
                            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ø',local_40,"p","hello\n","\"hello\\n\"",6,"6",
                                                (void *)0x0);
                            tVar7 = archive_entry_mtime(local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ù',0x15181,"86401",tVar7,
                                                "archive_entry_mtime(ae)",(void *)0x0);
                            tVar7 = archive_entry_atime(local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ú',0x15181,"86401",tVar7,
                                                "archive_entry_atime(ae)",(void *)0x0);
                            psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'û',1,"1",psVar8->st_nlink,
                                                "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                            lVar6 = archive_entry_uid(local_50);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ü',1,"1",lVar6,"archive_entry_uid(ae)",
                                                (void *)0x0);
                            lVar9 = archive_entry_gid(local_50);
                            wVar2 = L'ý';
                          }
                          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                              ,wVar2,2,"2",lVar9,"archive_entry_gid(ae)",(void *)0x0
                                             );
                          goto LAB_001779e7;
                        }
                        assertion_equal_string
                                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                   ,L'Ö',"dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9/dir10",
                                   "\"dir1/dir2/dir3/dir4/dir5/dir6/dir7\" \"/dir8/dir9/dir10\"",
                                   pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
                        mVar4 = archive_entry_filetype(local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'×',0x4000,"AE_IFDIR",(ulong)mVar4,
                                            "archive_entry_filetype(ae)",(void *)0x0);
                        lVar6 = archive_entry_size(local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ø',0x800,"2048",lVar6,"archive_entry_size(ae)",
                                            (void *)0x0);
                        tVar7 = archive_entry_mtime(local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ù',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                            (void *)0x0);
                        tVar7 = archive_entry_atime(local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ú',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                            (void *)0x0);
                        psVar8 = archive_entry_stat((archive_entry_conflict *)local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Û',2,"2",psVar8->st_nlink,
                                            "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                        lVar6 = archive_entry_uid(local_50);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ü',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
                        lVar9 = archive_entry_gid(local_50);
                        wVar2 = L'Ý';
                      }
                    }
                  }
                }
              }
            }
          }
        }
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,wVar2,2,"2",lVar9,"archive_entry_gid(ae)",(void *)0x0);
      }
    }
LAB_001779e7:
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar1 = archive_read_next_header((archive *)a,&local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'ą',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          (void *)0x0);
      iVar1 = archive_filter_code((archive *)a,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'Ĉ',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS"
                          ,(void *)0x0);
      iVar1 = archive_format((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'ĉ',(long)iVar1,"archive_format(a)",0x40001,
                          "ARCHIVE_FORMAT_ISO9660_ROCKRIDGE",(void *)0x0);
      iVar1 = archive_read_close((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'Č',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
      iVar1 = archive_read_free((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'č',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(test_read_format_isorr_rr_moved)
{
	const char *refname = "test_read_format_iso_rockridge_rr_moved.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 8 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 13; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));

		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			/* Now, we read timestamp recorded by RRIP "TF". */
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			/* Now, we read links recorded by RRIP "PX". */
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("dir1", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6/dir7",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
		   "/dir8",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
			    "/dir8",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
		   "/dir8/dir9",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
			    "/dir8/dir9",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
		   "/dir8/dir9/dir10",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
			    "/dir8/dir9/dir10",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("file", archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString("file", archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(12345684, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello\n", 6);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
		    "/dir8/dir9/dir10/deep",
		    archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
			    "/dir8/dir9/dir10/deep",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(12345684, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello\n", 6);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}